

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldNames
          (ParseFunctionGenerator *this,Formatter *format)

{
  uint8_t *__beg;
  Formatter *this_00;
  bool bVar1;
  pointer pTVar2;
  size_type sVar3;
  uchar *__end;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_44;
  uint local_40;
  int octal_size;
  int size;
  int i;
  uint8_t *sizes_end;
  uint8_t *sizes;
  uint8_t *p;
  Formatter *pFStack_18;
  int total_sizes;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  pFStack_18 = format;
  format_local = (Formatter *)this;
  pTVar2 = std::
           unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (&pTVar2->field_name_data);
  if (!bVar1) {
    pTVar2 = std::
             unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
             ::operator->(&this->tc_table_info_);
    sVar3 = std::
            vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ::size(&pTVar2->field_entries);
    p._4_4_ = (int)sVar3 + 8U & 0xfffffff8;
    pTVar2 = std::
             unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
             ::operator->(&this->tc_table_info_);
    sizes_end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          (&pTVar2->field_name_data);
    _size = sizes_end + (int)p._4_4_;
    sizes = sizes_end;
    Formatter::operator()<>(pFStack_18,"\"");
    for (octal_size = 0; octal_size < (int)p._4_4_; octal_size = octal_size + 1) {
      local_40 = (uint)*sizes;
      local_44 = ((int)local_40 >> 6) * 100 + ((int)local_40 >> 3 & 7U) * 10 + (local_40 & 7);
      sizes = sizes + 1;
      Formatter::operator()(pFStack_18,"\\$1$",&local_44);
    }
    Formatter::operator()<>(pFStack_18,"\"\n");
    for (; this_00 = pFStack_18, __beg = sizes, sizes_end < _size; sizes_end = sizes_end + 1) {
      if (*sizes_end != '\0') {
        __end = sizes + *sizes_end;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<unsigned_char_const*,void>
                  ((string *)&local_68,__beg,__end,&local_69);
        Formatter::operator()(this_00,"\"$1$\"\n",&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
      }
      sizes = sizes + (int)(uint)*sizes_end;
    }
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldNames(Formatter& format) {
  if (tc_table_info_->field_name_data.empty()) {
    // No names to output.
    return;
  }

  // We could just output the bytes directly, but we want it to look better than
  // that in the source code. Also, it is more efficient for compilation time to
  // have a literal string than an initializer list of chars.

  const int total_sizes =
      static_cast<int>(((tc_table_info_->field_entries.size() + 1) + 7) & ~7u);
  const uint8_t* p = tc_table_info_->field_name_data.data();
  const uint8_t* sizes = p;
  const uint8_t* sizes_end = sizes + total_sizes;

  // First print all the sizes as octal
  format("\"");
  for (int i = 0; i < total_sizes; ++i) {
    int size = *p++;
    int octal_size = ((size >> 6) & 3) * 100 +  //
                     ((size >> 3) & 7) * 10 +   //
                     ((size >> 0) & 7);
    format("\\$1$", octal_size);
  }
  format("\"\n");

  // Then print each name in a line of its own
  for (; sizes < sizes_end; p += *sizes++) {
    if (*sizes != 0) format("\"$1$\"\n", std::string(p, p + *sizes));
  }
}